

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O0

void __thiscall
Assimp::STEP::LazyObject::LazyObject
          (LazyObject *this,DB *db,uint64_t id,uint64_t param_3,char *type,char *args)

{
  uint64_t this_00;
  bool bVar1;
  uint64_t who;
  int64_t local_48;
  int64_t skip_depth;
  char *a;
  char *args_local;
  char *type_local;
  uint64_t param_3_local;
  uint64_t id_local;
  DB *db_local;
  LazyObject *this_local;
  
  this->id = id;
  this->type = type;
  this->db = db;
  this->args = args;
  this->obj = (Object *)0x0;
  a = args;
  args_local = type;
  type_local = (char *)param_3;
  param_3_local = id;
  id_local = (uint64_t)db;
  db_local = (DB *)this;
  bVar1 = DB::KeepInverseIndicesForType(db,type);
  if (bVar1) {
    local_48 = 0;
    for (skip_depth = (int64_t)a; *(char *)skip_depth != '\0'; skip_depth = skip_depth + 1) {
      handleSkippedDepthFromToken((char *)skip_depth,&local_48);
      this_00 = id_local;
      if ((0 < local_48) && (*(char *)skip_depth == '#')) {
        if (*(char *)(skip_depth + 1) == '#') {
          skip_depth = skip_depth + 1;
        }
        else {
          who = getIdFromToken((char *)skip_depth);
          DB::MarkRef((DB *)this_00,who,param_3_local);
        }
      }
    }
  }
  return;
}

Assistant:

STEP::LazyObject::LazyObject(DB& db, uint64_t id,uint64_t /*line*/, const char* const type,const char* args)
: id(id)
, type(type)
, db(db)
, args(args)
, obj() {
    // find any external references and store them in the database.
    // this helps us emulate STEPs INVERSE fields.
    if (!db.KeepInverseIndicesForType(type)) {
        return;
    }

    // do a quick scan through the argument tuple and watch out for entity references
    const char *a( args );
    int64_t skip_depth( 0 );
    while ( *a ) {
        handleSkippedDepthFromToken(a, skip_depth);
        /*if (*a == '(') {
            ++skip_depth;
        } else if (*a == ')') {
            --skip_depth;
        }*/

		if (skip_depth >= 1 && *a=='#') {
			if (*(a + 1) != '#') {
				/*const char *tmp;
				const int64_t num = static_cast<int64_t>(strtoul10_64(a + 1, &tmp));
				db.MarkRef(num, id);*/
                db.MarkRef(getIdFromToken(a), id);
			} else {
				++a;
			}
        }
        ++a;
    }
}